

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathQuat.h
# Opt level: O0

Quat<float> * __thiscall Imath_3_2::Quat<float>::operator*=(Quat<float> *this,Quat<float> *q)

{
  float *in_RSI;
  Quat<float> *in_RDI;
  float fVar1;
  float rtmp;
  Vec3<float> *in_stack_ffffffffffffff98;
  float fVar2;
  float a;
  Vec3<float> local_20;
  float local_14;
  
  a = in_RDI->r;
  fVar2 = *in_RSI;
  fVar1 = Vec3<float>::operator^((Vec3<float> *)CONCAT44(a,fVar2),in_stack_ffffffffffffff98);
  local_14 = a * fVar2 + -fVar1;
  Imath_3_2::operator*((float)((ulong)in_RDI >> 0x20),(Vec3<float> *)CONCAT44(a,fVar2));
  Vec3<float>::operator*((Vec3<float> *)in_RDI,a);
  Vec3<float>::operator+((Vec3<float> *)in_RDI,(Vec3<float> *)CONCAT44(a,fVar2));
  Vec3<float>::operator%((Vec3<float> *)in_RDI,(Vec3<float> *)CONCAT44(a,fVar2));
  Vec3<float>::operator+((Vec3<float> *)in_RDI,(Vec3<float> *)CONCAT44(a,fVar2));
  Vec3<float>::operator=(&in_RDI->v,&local_20);
  in_RDI->r = local_14;
  return in_RDI;
}

Assistant:

const Quat<T>&
Quat<T>::operator*= (const Quat<T>& q) IMATH_NOEXCEPT
{
    T rtmp = r * q.r - (v ^ q.v);
    v      = r * q.v + v * q.r + v % q.v;
    r      = rtmp;
    return *this;
}